

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::TransformedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,TransformedPrimitive *this,
          Ray *r,Float tMax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  double dVar7;
  Float va;
  Float tMax_local;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_248;
  bool local_148;
  double vb;
  Interval IStack_138;
  Interval IStack_130;
  Float FStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  Tuple3<pbrt::Normal3,_float> aTStack_118 [2];
  MediumInterface *local_100;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_f8;
  Tuple3<pbrt::Vector3,_float> local_f0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_d8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_c0 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_a8 [2];
  Tuple3<pbrt::Normal3,_float> TStack_90;
  int iStack_84;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_80;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_78;
  Tuple3<pbrt::Vector3,_float> local_70 [3];
  Float FStack_4c;
  Ray ray;
  
  tMax_local = tMax;
  Transform::ApplyInverse(&ray,*(Transform **)(this + 8),r,&tMax_local);
  PrimitiveHandle::Intersect
            ((optional<pbrt::ShapeIntersection> *)&local_248.__align,(PrimitiveHandle *)this,&ray,
             tMax_local);
  if (local_148 == true) {
    vb = (double)tMax_local * 1.001;
    va = (Float)local_248._248_4_;
    if (vb <= (double)(float)local_248._248_4_) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0x80,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [9])"si->tHit",
                 (char (*) [13])"1.001 * tMax",(char (*) [9])"si->tHit",&va,
                 (char (*) [13])"1.001 * tMax",&vb);
    }
    Transform::operator()
              ((SurfaceInteraction *)&vb,*(Transform **)(this + 8),
               (SurfaceInteraction *)&local_248.__align);
    dVar7 = vb;
    if (local_148 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    va = 0.0;
    local_248._64_8_ = local_100;
    local_248.__align = (anon_struct_8_0_00000001_for___align)vb;
    local_248._8_4_ = IStack_138.low;
    local_248._12_4_ = IStack_138.high;
    local_248._16_4_ = IStack_130.low;
    local_248._20_4_ = IStack_130.high;
    local_248._24_4_ = FStack_128;
    local_248._28_4_ = fStack_124;
    local_248._32_4_ = fStack_120;
    local_248._36_4_ = fStack_11c;
    local_248._40_4_ = aTStack_118[0].x;
    local_248._44_4_ = aTStack_118[0].y;
    uVar3 = local_248._40_8_;
    local_248._48_4_ = aTStack_118[0].z;
    local_248._52_4_ = aTStack_118[1].x;
    uVar4 = local_248._48_8_;
    local_248._56_4_ = aTStack_118[1].y;
    local_248._60_4_ = aTStack_118[1].z;
    local_248._72_8_ = local_f8.bits;
    local_248._80_4_ = local_f0[0].x;
    local_248._84_4_ = local_f0[0].y;
    local_248._88_4_ = local_f0[0].z;
    local_248._92_4_ = local_f0[1].x;
    local_248._96_4_ = local_f0[1].y;
    local_248._100_4_ = local_f0[1].z;
    local_248._104_4_ = aTStack_d8[0].x;
    local_248._108_4_ = aTStack_d8[0].y;
    local_248._112_4_ = aTStack_d8[0].z;
    local_248._116_4_ = aTStack_d8[1].x;
    local_248._120_4_ = aTStack_d8[1].y;
    local_248._124_4_ = aTStack_d8[1].z;
    local_248._128_4_ = aTStack_c0[0].x;
    local_248._132_4_ = aTStack_c0[0].y;
    uVar5 = local_248._128_8_;
    local_248._136_4_ = aTStack_c0[0].z;
    local_248._140_4_ = aTStack_c0[1].x;
    uVar6 = local_248._136_8_;
    local_248._144_4_ = aTStack_c0[1].y;
    local_248._148_4_ = aTStack_c0[1].z;
    local_248._152_4_ = aTStack_a8[0].x;
    local_248._156_4_ = aTStack_a8[0].y;
    local_248._160_4_ = aTStack_a8[0].z;
    local_248._164_4_ = aTStack_a8[1].x;
    local_248._168_4_ = aTStack_a8[1].y;
    local_248._172_4_ = aTStack_a8[1].z;
    local_248._176_4_ = TStack_90.x;
    local_248._180_4_ = TStack_90.y;
    local_248._184_4_ = TStack_90.z;
    local_248._188_4_ = iStack_84;
    local_248._192_8_ = local_80.bits;
    local_248._200_8_ = local_78.bits;
    local_248._240_4_ = local_70[2].z;
    local_248._244_4_ = FStack_4c;
    local_248._208_4_ = local_70[0].x;
    local_248._212_4_ = local_70[0].y;
    local_248._216_4_ = local_70[0].z;
    local_248._220_4_ = local_70[1].x;
    local_248._224_4_ = local_70[1].y;
    local_248._228_4_ = local_70[1].z;
    local_248._232_4_ = local_70[2].x;
    local_248._236_4_ = local_70[2].y;
    local_248._48_4_ = (undefined4)aTStack_118._8_8_;
    local_248._136_4_ = (undefined4)aTStack_c0._8_8_;
    local_248._44_4_ = SUB84(aTStack_118[0]._0_8_,4);
    local_248._40_4_ = (undefined4)aTStack_118[0]._0_8_;
    local_248._132_4_ = SUB84(aTStack_c0[0]._0_8_,4);
    auVar1 = vfmadd132ss_fma(ZEXT416((uint)local_248._44_4_),
                             ZEXT416((uint)((float)local_248._48_4_ * (float)local_248._136_4_)),
                             ZEXT416((uint)local_248._132_4_));
    auVar2 = vfmsub213ss_fma(ZEXT416((uint)local_248._136_4_),ZEXT416((uint)local_248._48_4_),
                             ZEXT416((uint)((float)local_248._48_4_ * (float)local_248._136_4_)));
    local_248._128_4_ = (undefined4)aTStack_c0[0]._0_8_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_)),
                             ZEXT416((uint)local_248._40_4_),ZEXT416((uint)local_248._128_4_));
    vb = (double)CONCAT44(vb._4_4_,auVar1._0_4_);
    if (auVar1._0_4_ < 0.0) {
      local_248._40_8_ = uVar3;
      local_248._48_8_ = uVar4;
      local_248._128_8_ = uVar5;
      local_248._136_8_ = uVar6;
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0x84,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x56f16e,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&vb,
                 (char (*) [2])0x56f16e,(int *)&va);
    }
    __return_storage_ptr__->set = local_148;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_100;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)dVar7;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) = IStack_138;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) = IStack_130;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = _FStack_128;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = _fStack_120;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = aTStack_118[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = aTStack_118._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = aTStack_118[1]._4_8_;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_f8.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_f0[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_f0._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_f0[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = aTStack_d8[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = aTStack_d8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = aTStack_d8[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_c0[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_c0._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_c0[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_c0._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = aTStack_c0[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = aTStack_a8[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = aTStack_a8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = aTStack_a8[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = TStack_90._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = stack0xffffffffffffff78;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_80.bits;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 200) = local_78.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_70[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_70._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_70[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_70[2]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = stack0xffffffffffffffb0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_248._248_4_;
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> TransformedPrimitive::Intersect(const Ray &r,
                                                                  Float tMax) const {
    // Transform ray to primitive-space and intersect with primitive
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);

    // Return transformed instance's intersection information
    si->intr = (*renderFromPrimitive)(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}